

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * __thiscall cmGeneratorTarget::ImportedGetLocation(cmGeneratorTarget *this,string *config)

{
  string local_30;
  
  if (ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_ == '\0') {
    ImportedGetLocation();
  }
  if (this->Target->IsImportedTarget != false) {
    cmTarget::ImportedGetFullPath(&local_30,this->Target,config,false);
    std::__cxx11::string::operator=
              ((string *)&ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_,
               (string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return ImportedGetLocation(std::__cxx11::string_const&)::location_abi_cxx11_._M_dataplus._M_p;
  }
  __assert_fail("this->IsImported()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                ,0xd90,
                "const char *cmGeneratorTarget::ImportedGetLocation(const std::string &) const");
}

Assistant:

const char*
cmGeneratorTarget::ImportedGetLocation(const std::string& config) const
{
  static std::string location;
  assert(this->IsImported());
  location = this->Target->ImportedGetFullPath(config, false);
  return location.c_str();
}